

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Frame::IsValid(Frame *this)

{
  uint8_t *puVar1;
  
  if ((this->length_ != 0) && (this->frame_ != (uint8_t *)0x0)) {
    puVar1 = this->additional_;
    if (((this->additional_length_ == 0 || puVar1 != (uint8_t *)0x0) &&
        ((this->additional_length_ != 0 || puVar1 == (uint8_t *)0x0 &&
         (0xffffffffffffff81 < this->track_number_ - 0x7f)))) &&
       (((puVar1 == (uint8_t *)0x0 && ((this->discard_padding_ == 0 && (this->duration_ == 0)))) ||
        ((this->is_key_ != false || (this->reference_block_timestamp_set_ == true)))))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Frame::IsValid() const {
  if (length_ == 0 || !frame_) {
    return false;
  }
  if ((additional_length_ != 0 && !additional_) ||
      (additional_ != NULL && additional_length_ == 0)) {
    return false;
  }
  if (track_number_ == 0 || track_number_ > kMaxTrackNumber) {
    return false;
  }
  if (!CanBeSimpleBlock() && !is_key_ && !reference_block_timestamp_set_) {
    return false;
  }
  return true;
}